

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiStoragePair *pIVar1;
  ImGuiTable *pIVar2;
  char *ptr;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = (ulong)(uint)(ctx->Tables).Map.Data.Size;
  if (uVar3 != 0) {
    pIVar1 = (ctx->Tables).Map.Data.Data;
    lVar4 = 0;
    do {
      lVar5 = (long)*(int *)((long)&pIVar1->field_1 + lVar4);
      pIVar2 = (ctx->Tables).Buf.Data;
      if (pIVar2 != (ImGuiTable *)0x0 && lVar5 != -1) {
        pIVar2[lVar5].SettingsOffset = -1;
      }
      lVar4 = lVar4 + 0x10;
    } while (uVar3 << 4 != lVar4);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}